

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int get_pattr(attr_list list,int index,atom_t *name,attr_value_type *val_type,attr_union *value)

{
  attr_union *paVar1;
  uint uVar2;
  int_attr_struct *piVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  attr_list p_Var7;
  ulong uVar8;
  
  while (p_Var7 = list, p_Var7->list_of_lists != 0) {
    uVar2 = (p_Var7->l).lists.sublist_count;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar8 = 0;
    while( true ) {
      if (uVar2 == uVar8) {
        return 0;
      }
      list = (p_Var7->l).lists.lists[uVar8];
      iVar5 = attr_count(list);
      if (index < iVar5) break;
      uVar8 = uVar8 + 1;
      index = index - iVar5;
    }
  }
  piVar3 = (p_Var7->l).list.iattrs;
  lVar6 = (long)index;
  if (index < (int)(uint)piVar3->int_attr_count) {
    *name = piVar3->iattr[lVar6].attr_id;
    *val_type = Attr_Int4;
    (value->u).f = (float)((p_Var7->l).list.iattrs)->iattr[lVar6].value;
  }
  else {
    lVar6 = lVar6 - (ulong)piVar3->int_attr_count;
    if ((int)(uint)piVar3->other_attr_count <= (int)lVar6) {
      return 0;
    }
    *name = (p_Var7->l).list.attributes[lVar6].attr_id;
    *val_type = (p_Var7->l).list.attributes[lVar6].val_type;
    paVar1 = &(p_Var7->l).list.attributes[lVar6].value;
    pvVar4 = (paVar1->u).o.buffer;
    (value->u).d = (paVar1->u).d;
    (value->u).o.buffer = pvVar4;
  }
  return 1;
}

Assistant:

int
get_pattr(attr_list list,int index, atom_t *name,
	  attr_value_type *val_type, attr_union *value)
{
    if (!list->list_of_lists) {
	if (index < list->l.list.iattrs->int_attr_count) {
	    *name = list->l.list.iattrs->iattr[index].attr_id;
	    *val_type = Attr_Int4;
	    value->u.i = list->l.list.iattrs->iattr[index].value;
	    return 1;
	}
	index -= list->l.list.iattrs->int_attr_count;
	if (index < list->l.list.iattrs->other_attr_count) {
	    *name = list->l.list.attributes[index].attr_id;
	    *val_type = list->l.list.attributes[index].val_type;
	    *value = list->l.list.attributes[index].value;
	    return 1;
	}
	return 0;
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            int count = attr_count(list->l.lists.lists[i]);
            if (index < count) {
                return get_pattr(list->l.lists.lists[i], index, name, 
				val_type, value);
            } else {
                index -= count;
            }
        }
        return 0;
    }   
}